

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsg_unittest.cc
# Opt level: O1

void __thiscall
StunMsg_RFC5769SampleIPv6Response_Test::TestBody(StunMsg_RFC5769SampleIPv6Response_Test *this)

{
  undefined8 uVar1;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  stun_attr_varsize *attr;
  void *vec_a;
  stun_attr_xor_sockaddr *attr_00;
  ulong uVar5;
  stun_attr_msgint *msgint;
  stun_attr_hdr *attr_hdr;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  undefined8 *puVar9;
  stun_msg_hdr *psVar10;
  char *pcVar11;
  char *in_R9;
  AssertionResult gtest_ar_;
  sockaddr_in6 test_addr;
  char software_name [12];
  uint8_t tsx_id [12];
  char password [23];
  sockaddr_in6 ipv6;
  uint8_t expected_result [92];
  uint8_t buffer [92];
  AssertHelper local_178;
  AssertHelper local_170;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  string local_158;
  undefined8 local_138;
  undefined4 local_130;
  uint8_t local_128 [16];
  uint8_t local_118 [36];
  sockaddr local_f4;
  ulong local_e4;
  stun_msg_hdr local_d8 [4];
  undefined4 local_80;
  stun_msg_hdr local_78 [4];
  
  local_138 = 0x6365762074736574;
  local_130 = 0x726f74;
  builtin_memcpy(local_118,"VOkJxbRl1RmTxUk/WvJxBt",0x17);
  puVar9 = &DAT_0014a990;
  psVar10 = local_d8;
  for (lVar6 = 0xb; lVar6 != 0; lVar6 = lVar6 + -1) {
    uVar1 = *puVar9;
    psVar10->type = (short)uVar1;
    psVar10->length = (short)((ulong)uVar1 >> 0x10);
    psVar10->magic = (int)((ulong)uVar1 >> 0x20);
    puVar9 = puVar9 + 1;
    psVar10 = (stun_msg_hdr *)psVar10->tsx_id;
  }
  local_80 = 0x4c0bfbc8;
  local_128[0] = 0xb7;
  local_128[1] = 0xe7;
  local_128[2] = 0xa7;
  local_128[3] = '\x01';
  local_128[4] = 0xbc;
  local_128[5] = '4';
  local_128[6] = 0xd6;
  local_128[7] = 0x86;
  local_128[8] = 0xfa;
  local_128[9] = 0x87;
  local_128[10] = 0xdf;
  local_128[0xb] = 0xae;
  local_f4.sa_family = 10;
  local_f4.sa_data[0] = -0x80;
  local_f4.sa_data[1] = 'U';
  inet_pton(10,"2001:db8:1234:5678:11:2233:4455:6677",local_f4.sa_data + 6);
  local_168.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000005c;
  local_178.data_ = (AssertHelperData *)&DAT_0000005c;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_158,"sizeof(expected_result)","sizeof(buffer)",
             (unsigned_long *)&local_168,(unsigned_long *)&local_178);
  if ((char)local_158._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_168);
    if ((undefined8 *)CONCAT44(local_158._M_string_length._4_4_,(uint)local_158._M_string_length) ==
        (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)CONCAT44(local_158._M_string_length._4_4_,(uint)local_158._M_string_length
                                  );
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
               ,0x167,pcVar11);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if (local_168.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_168.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_168.ptr_ + 8))();
      }
      local_168.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_158._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_158._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_168.ptr_._0_4_ = 1;
  iVar4 = stun_msg_verify(local_d8,0x5c);
  local_178.data_._0_4_ = iVar4;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_158,"1",
             "stun_msg_verify((stun_msg_hdr*)expected_result, sizeof(expected_result))",
             (int *)&local_168,(int *)&local_178);
  if ((char)local_158._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_168);
    if ((undefined8 *)CONCAT44(local_158._M_string_length._4_4_,(uint)local_158._M_string_length) ==
        (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)CONCAT44(local_158._M_string_length._4_4_,(uint)local_158._M_string_length
                                  );
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
               ,0x169,pcVar11);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if (local_168.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_168.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_168.ptr_ + 8))();
      }
      local_168.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_158._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_158._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  stun_msg_hdr_init(local_78,0x101,local_128);
  stun_attr_varsize_add(local_78,0x8022,&local_138,0xb,' ');
  stun_attr_xor_sockaddr_add(local_78,0x20,&local_f4);
  stun_attr_msgint_add(local_78,local_118,0x16);
  stun_attr_fingerprint_add(local_78);
  anon_unknown.dwarf_9b63::IsEqual((anon_unknown_dwarf_9b63 *)&local_168,local_d8,local_78,0x5c);
  if (local_168.ptr_._0_1_ == (anon_unknown_dwarf_9b63)0x0) {
    testing::Message::Message((Message *)&local_178);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_158,(internal *)&local_168,
               (AssertionResult *)"IsEqual(expected_result, buffer, sizeof(expected_result))",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
               ,0x174,local_158._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,
                      CONCAT44(local_158.field_2._M_allocated_capacity._4_4_,
                               local_158.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if (local_178.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_178.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_178.data_ + 8))();
      }
      local_178.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_160,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_168.ptr_._0_4_ = 0x101;
  uVar3 = stun_msg_type(local_d8);
  local_178.data_._0_2_ = uVar3;
  testing::internal::CmpHelperEQ<stun_msg_type,unsigned_short>
            ((internal *)&local_158,"STUN_BINDING_RESPONSE","stun_msg_type(msg_hdr)",
             (stun_msg_type *)&local_168,(unsigned_short *)&local_178);
  if ((char)local_158._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_168);
    if ((undefined8 *)CONCAT44(local_158._M_string_length._4_4_,(uint)local_158._M_string_length) ==
        (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)CONCAT44(local_158._M_string_length._4_4_,(uint)local_158._M_string_length
                                  );
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
               ,0x178,pcVar11);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if (local_168.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_168.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_168.ptr_ + 8))();
      }
      local_168.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_158._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_168.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000005c;
  local_178.data_ = (AssertHelperData *)stun_msg_len(local_d8);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_158,"sizeof(expected_result)","stun_msg_len(msg_hdr)",
             (unsigned_long *)&local_168,(unsigned_long *)&local_178);
  if ((char)local_158._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_168);
    if ((undefined8 *)CONCAT44(local_158._M_string_length._4_4_,(uint)local_158._M_string_length) ==
        (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)CONCAT44(local_158._M_string_length._4_4_,(uint)local_158._M_string_length
                                  );
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
               ,0x179,pcVar11);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if (local_168.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_168.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_168.ptr_ + 8))();
      }
      local_168.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_158._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  attr = (stun_attr_varsize *)stun_msg_next_attr(local_d8,(stun_attr_hdr *)0x0);
  local_168.ptr_._0_4_ = 0x8022;
  uVar3 = stun_attr_type((stun_attr_hdr *)attr);
  local_178.data_._0_2_ = uVar3;
  testing::internal::CmpHelperEQ<stun_attr_type,unsigned_short>
            ((internal *)&local_158,"STUN_ATTR_SOFTWARE","stun_attr_type(attr_hdr)",
             (stun_attr_type *)&local_168,(unsigned_short *)&local_178);
  if ((char)local_158._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_168);
    if ((undefined8 *)CONCAT44(local_158._M_string_length._4_4_,(uint)local_158._M_string_length) ==
        (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)CONCAT44(local_158._M_string_length._4_4_,(uint)local_158._M_string_length
                                  );
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
               ,0x17c,pcVar11);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if (local_168.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_168.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_168.ptr_ + 8))();
      }
      local_168.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_158._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_168.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000b;
  local_178.data_ = (AssertHelperData *)stun_attr_len((stun_attr_hdr *)attr);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_158,"sizeof(software_name)-1","stun_attr_len(attr_hdr)",
             (unsigned_long *)&local_168,(unsigned_long *)&local_178);
  if ((char)local_158._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_168);
    if ((undefined8 *)CONCAT44(local_158._M_string_length._4_4_,(uint)local_158._M_string_length) ==
        (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)CONCAT44(local_158._M_string_length._4_4_,(uint)local_158._M_string_length
                                  );
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
               ,0x17d,pcVar11);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if (local_168.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_168.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_168.ptr_ + 8))();
      }
      local_168.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_158._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_158._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  vec_a = stun_attr_varsize_read(attr);
  anon_unknown.dwarf_9b63::IsEqual((anon_unknown_dwarf_9b63 *)&local_168,vec_a,&local_138,0xb);
  if (local_168.ptr_._0_1_ == (anon_unknown_dwarf_9b63)0x0) {
    testing::Message::Message((Message *)&local_178);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_158,(internal *)&local_168,
               (AssertionResult *)"IsEqual(data, software_name, sizeof(software_name)-1)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
               ,0x17f,local_158._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,
                      CONCAT44(local_158.field_2._M_allocated_capacity._4_4_,
                               local_158.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if (local_178.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_178.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_178.data_ + 8))();
      }
      local_178.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_160,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  attr_00 = (stun_attr_xor_sockaddr *)stun_msg_next_attr(local_d8,(stun_attr_hdr *)attr);
  local_168.ptr_._0_4_ = 0x20;
  uVar3 = stun_attr_type((stun_attr_hdr *)attr_00);
  local_178.data_._0_2_ = uVar3;
  testing::internal::CmpHelperEQ<stun_attr_type,unsigned_short>
            ((internal *)&local_158,"STUN_ATTR_XOR_MAPPED_ADDRESS","stun_attr_type(attr_hdr)",
             (stun_attr_type *)&local_168,(unsigned_short *)&local_178);
  if ((char)local_158._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_168);
    if ((undefined8 *)CONCAT44(local_158._M_string_length._4_4_,(uint)local_158._M_string_length) ==
        (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)CONCAT44(local_158._M_string_length._4_4_,(uint)local_158._M_string_length
                                  );
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
               ,0x182,pcVar11);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if (local_168.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_168.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_168.ptr_ + 8))();
      }
      local_168.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_158._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_158.field_2._M_allocated_capacity._0_4_ = 0;
  local_158.field_2._M_allocated_capacity._4_4_ = 0;
  local_158.field_2._8_4_ = 0;
  local_158._M_dataplus._M_p = (pointer)0x0;
  local_158._M_string_length._0_4_ = 0;
  local_158._M_string_length._4_4_ = 0;
  local_178.data_ = local_178.data_ & 0xffffffff00000000;
  local_170.data_._0_4_ = stun_attr_xor_sockaddr_read(attr_00,local_d8,(sockaddr *)&local_158);
  testing::internal::CmpHelperEQ<stun_status_type,int>
            ((internal *)&local_168,"STUN_OK",
             "stun_attr_xor_sockaddr_read( (stun_attr_sockaddr*)attr_hdr, msg_hdr, (sockaddr*)&test_addr)"
             ,(stun_status_type *)&local_178,(int *)&local_170);
  if (local_168.ptr_._0_1_ == (anon_unknown_dwarf_9b63)0x0) {
    testing::Message::Message((Message *)&local_178);
    if (local_160.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar11 = "";
    }
    else {
      pcVar11 = ((local_160.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
               ,0x186,pcVar11);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if (local_178.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_178.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_178.data_ + 8))();
      }
      local_178.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_160,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_178.data_._0_4_ = 10;
  testing::internal::CmpHelperEQ<int,unsigned_short>
            ((internal *)&local_168,"10","test_addr.sin6_family",(int *)&local_178,
             (unsigned_short *)&local_158);
  if (local_168.ptr_._0_1_ == (anon_unknown_dwarf_9b63)0x0) {
    testing::Message::Message((Message *)&local_178);
    if (local_160.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar11 = "";
    }
    else {
      pcVar11 = ((local_160.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
               ,0x187,pcVar11);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if (local_178.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_178.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_178.data_ + 8))();
      }
      local_178.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_160,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_178.data_._0_2_ = 0x5580;
  testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
            ((internal *)&local_168,"__bswap_16 (32853)","test_addr.sin6_port",
             (unsigned_short *)&local_178,(unsigned_short *)((long)&local_158._M_dataplus._M_p + 2))
  ;
  if (local_168.ptr_._0_1_ == (anon_unknown_dwarf_9b63)0x0) {
    testing::Message::Message((Message *)&local_178);
    if (local_160.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar11 = "";
    }
    else {
      pcVar11 = ((local_160.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
               ,0x188,pcVar11);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if (local_178.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_178.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_178.data_ + 8))();
      }
      local_178.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_160,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_178.data_ = local_178.data_ & 0xffffffff00000000;
  uVar5 = (ulong)(local_158._M_string_length._4_4_ >> 0x18) |
          (((ulong)local_158._M_string_length._4_4_ & 0xff0000) << 0x20) >> 0x28 |
          (((ulong)local_158._M_string_length._4_4_ & 0xff00) << 0x20) >> 0x18 |
          (((ulong)local_158._M_string_length._4_4_ & 0xff) << 0x20) >> 8 |
          ((ulong)(uint)local_158._M_string_length & 0xff000000) << 8 |
          ((ulong)(uint)local_158._M_string_length & 0xff0000) << 0x18 |
          ((ulong)(uint)local_158._M_string_length & 0xff00) << 0x28 |
          CONCAT44(local_158._M_string_length._4_4_,(uint)local_158._M_string_length) << 0x38;
  uVar7 = (ulong)local_f4.sa_data._6_8_ >> 0x38 |
          (local_f4.sa_data._6_8_ & 0xff000000000000) >> 0x28 |
          (local_f4.sa_data._6_8_ & 0xff0000000000) >> 0x18 |
          (local_f4.sa_data._6_8_ & 0xff00000000) >> 8 | (local_f4.sa_data._6_8_ & 0xff000000) << 8
          | (local_f4.sa_data._6_8_ & 0xff0000) << 0x18 | (local_f4.sa_data._6_8_ & 0xff00) << 0x28
          | local_f4.sa_data._6_8_ << 0x38;
  if (uVar5 == uVar7) {
    uVar5 = (ulong)((uint)local_158.field_2._M_allocated_capacity._4_4_ >> 0x18) |
            (((ulong)(uint)local_158.field_2._M_allocated_capacity._4_4_ & 0xff0000) << 0x20) >>
            0x28 | (((ulong)(uint)local_158.field_2._M_allocated_capacity._4_4_ & 0xff00) << 0x20)
                   >> 0x18 |
            (((ulong)(uint)local_158.field_2._M_allocated_capacity._4_4_ & 0xff) << 0x20) >> 8 |
            ((ulong)(uint)local_158.field_2._M_allocated_capacity._0_4_ & 0xff000000) << 8 |
            ((ulong)(uint)local_158.field_2._M_allocated_capacity._0_4_ & 0xff0000) << 0x18 |
            ((ulong)(uint)local_158.field_2._M_allocated_capacity._0_4_ & 0xff00) << 0x28 |
            CONCAT44(local_158.field_2._M_allocated_capacity._4_4_,
                     local_158.field_2._M_allocated_capacity._0_4_) << 0x38;
    uVar7 = local_e4 >> 0x38 | (local_e4 & 0xff000000000000) >> 0x28 |
            (local_e4 & 0xff0000000000) >> 0x18 | (local_e4 & 0xff00000000) >> 8 |
            (local_e4 & 0xff000000) << 8 | (local_e4 & 0xff0000) << 0x18 |
            (local_e4 & 0xff00) << 0x28 | local_e4 << 0x38;
    uVar8 = 0;
    if (uVar5 == uVar7) goto LAB_00122d9b;
  }
  uVar8 = -(uint)(uVar5 < uVar7) | 1;
LAB_00122d9b:
  local_170.data_._0_4_ = uVar8;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_168,"0",
             "memcmp(&test_addr.sin6_addr, &ipv6.sin6_addr, sizeof(ipv6.sin6_addr))",
             (int *)&local_178,(int *)&local_170);
  if (local_168.ptr_._0_1_ == (anon_unknown_dwarf_9b63)0x0) {
    testing::Message::Message((Message *)&local_178);
    if (local_160.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar11 = "";
    }
    else {
      pcVar11 = ((local_160.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
               ,0x18a,pcVar11);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if (local_178.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_178.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_178.data_ + 8))();
      }
      local_178.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_160,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  msgint = (stun_attr_msgint *)stun_msg_next_attr(local_d8,(stun_attr_hdr *)attr_00);
  local_178.data_._0_4_ = 8;
  uVar3 = stun_attr_type((stun_attr_hdr *)msgint);
  local_170.data_._0_2_ = uVar3;
  testing::internal::CmpHelperEQ<stun_attr_type,unsigned_short>
            ((internal *)&local_168,"STUN_ATTR_MESSAGE_INTEGRITY","stun_attr_type(attr_hdr)",
             (stun_attr_type *)&local_178,(unsigned_short *)&local_170);
  if (local_168.ptr_._0_1_ == (anon_unknown_dwarf_9b63)0x0) {
    testing::Message::Message((Message *)&local_178);
    if (local_160.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar11 = "";
    }
    else {
      pcVar11 = ((local_160.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
               ,0x18d,pcVar11);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if (local_178.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_178.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_178.data_ + 8))();
      }
      local_178.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_160,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_178.data_._0_4_ = 1;
  iVar4 = stun_attr_msgint_check(msgint,local_d8,local_118,0x16);
  local_170.data_._0_4_ = iVar4;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_168,"1",
             "stun_attr_msgint_check((stun_attr_msgint*)attr_hdr, msg_hdr, (uint8_t*)password, sizeof(password)-1)"
             ,(int *)&local_178,(int *)&local_170);
  if (local_168.ptr_._0_1_ == (anon_unknown_dwarf_9b63)0x0) {
    testing::Message::Message((Message *)&local_178);
    if (local_160.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar11 = "";
    }
    else {
      pcVar11 = ((local_160.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
               ,399,pcVar11);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if (local_178.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_178.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_178.data_ + 8))();
      }
      local_178.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_160,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  attr_hdr = stun_msg_next_attr(local_d8,(stun_attr_hdr *)msgint);
  local_178.data_._0_4_ = 0x8028;
  uVar3 = stun_attr_type(attr_hdr);
  local_170.data_._0_2_ = uVar3;
  testing::internal::CmpHelperEQ<stun_attr_type,unsigned_short>
            ((internal *)&local_168,"STUN_ATTR_FINGERPRINT","stun_attr_type(attr_hdr)",
             (stun_attr_type *)&local_178,(unsigned_short *)&local_170);
  if (local_168.ptr_._0_1_ == (anon_unknown_dwarf_9b63)0x0) {
    testing::Message::Message((Message *)&local_178);
    if (local_160.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar11 = "";
    }
    else {
      pcVar11 = ((local_160.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
               ,0x192,pcVar11);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if (local_178.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_178.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_178.data_ + 8))();
      }
      local_178.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_160,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_178.data_ = (AssertHelperData *)stun_msg_next_attr(local_d8,attr_hdr);
  local_170.data_ = (AssertHelperData *)0x0;
  testing::internal::CmpHelperEQ<_stun_attr_hdr_const*,_stun_attr_hdr_const*>
            ((internal *)&local_168,"__null","attr_hdr",(_stun_attr_hdr **)&local_170,
             (_stun_attr_hdr **)&local_178);
  if (local_168.ptr_._0_1_ == (anon_unknown_dwarf_9b63)0x0) {
    testing::Message::Message((Message *)&local_178);
    if (local_160.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar11 = "";
    }
    else {
      pcVar11 = ((local_160.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
               ,0x195,pcVar11);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if (local_178.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_178.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_178.data_ + 8))();
      }
      local_178.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_160,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(StunMsg, RFC5769SampleIPv6Response) {
  const char software_name[] = "test vector";
  const char password[] = "VOkJxbRl1RmTxUk/WvJxBt";

  const uint8_t expected_result[] = {
    0x01,0x01,0x00,0x48, //    Request type and message length
    0x21,0x12,0xa4,0x42, //    Magic cookie
    0xb7,0xe7,0xa7,0x01, // }
    0xbc,0x34,0xd6,0x86, // }  Transaction ID
    0xfa,0x87,0xdf,0xae, // }
    0x80,0x22,0x00,0x0b, //    SOFTWARE attribute header
    0x74,0x65,0x73,0x74, // }
    0x20,0x76,0x65,0x63, // }  UTF-8 server name
    0x74,0x6f,0x72,0x20, // }
    0x00,0x20,0x00,0x14, //    XOR-MAPPED-ADDRESS attribute header
    0x00,0x02,0xa1,0x47, //    Address family (IPv4) and xor'd mapped port number
    0x01,0x13,0xa9,0xfa, // }
    0xa5,0xd3,0xf1,0x79, // }  Xor'd mapped IPv6 address
    0xbc,0x25,0xf4,0xb5, // }
    0xbe,0xd2,0xb9,0xd9, // }
    0x00,0x08,0x00,0x14, //    MESSAGE-INTEGRITY attribute header
    0xa3,0x82,0x95,0x4e, // }
    0x4b,0xe6,0x7b,0xf1, // }
    0x17,0x84,0xc9,0x7c, // }  HMAC-SHA1 fingerprint
    0x82,0x92,0xc2,0x75, // }
    0xbf,0xe3,0xed,0x41, // }
    0x80,0x28,0x00,0x04, //    FINGERPRINT attribute header
    0xc8,0xfb,0x0b,0x4c, //    CRC32 fingerprint
  };

  uint8_t buffer[sizeof(stun_msg_hdr)
    + STUN_ATTR_VARSIZE_SIZE(sizeof(software_name)-1)
    + STUN_ATTR_SOCKADDR_SIZE(STUN_IPV6)
    + STUN_ATTR_MSGINT_SIZE
    + STUN_ATTR_UINT32_SIZE];

  stun_msg_hdr *msg_hdr = (stun_msg_hdr *)buffer;
  uint8_t tsx_id[12] = {
    0xb7,0xe7,0xa7,0x01,
    0xbc,0x34,0xd6,0x86,
    0xfa,0x87,0xdf,0xae
  };

  sockaddr_in6 ipv6;
  ipv6.sin6_family = AF_INET6;
  ipv6.sin6_port = htons(32853);
  inet_pton(AF_INET6, "2001:db8:1234:5678:11:2233:4455:6677", &ipv6.sin6_addr);

  ASSERT_EQ(sizeof(expected_result), sizeof(buffer));
  ASSERT_EQ(1, stun_msg_verify((stun_msg_hdr*)expected_result,
      sizeof(expected_result)));
  
  stun_msg_hdr_init(msg_hdr, STUN_BINDING_RESPONSE, tsx_id);
  stun_attr_varsize_add(msg_hdr, STUN_ATTR_SOFTWARE, software_name,
      sizeof(software_name)-1, ' ');
  stun_attr_xor_sockaddr_add(msg_hdr, STUN_ATTR_XOR_MAPPED_ADDRESS,
      (sockaddr *)&ipv6);
  stun_attr_msgint_add(msg_hdr, password, sizeof(password)-1);
  stun_attr_fingerprint_add(msg_hdr);

  EXPECT_TRUE(IsEqual(expected_result, buffer,
      sizeof(expected_result)));

  // Now decoding
  msg_hdr = (stun_msg_hdr *)expected_result;
  EXPECT_EQ(STUN_BINDING_RESPONSE, stun_msg_type(msg_hdr));
  EXPECT_EQ(sizeof(expected_result), stun_msg_len(msg_hdr));

  const stun_attr_hdr *attr_hdr = stun_msg_next_attr(msg_hdr, NULL);
  EXPECT_EQ(STUN_ATTR_SOFTWARE, stun_attr_type(attr_hdr));
  ASSERT_EQ(sizeof(software_name)-1, stun_attr_len(attr_hdr));
  const void* data = stun_attr_varsize_read((stun_attr_varsize*)attr_hdr);
  EXPECT_TRUE(IsEqual(data, software_name, sizeof(software_name)-1));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_XOR_MAPPED_ADDRESS, stun_attr_type(attr_hdr));
  sockaddr_in6 test_addr;
  memset(&test_addr, 0, sizeof(test_addr));
  EXPECT_EQ(STUN_OK, stun_attr_xor_sockaddr_read(
      (stun_attr_sockaddr*)attr_hdr, msg_hdr, (sockaddr*)&test_addr));
  EXPECT_EQ(AF_INET6, test_addr.sin6_family);
  EXPECT_EQ(htons(32853), test_addr.sin6_port);
  EXPECT_EQ(0, memcmp(&test_addr.sin6_addr, &ipv6.sin6_addr,
      sizeof(ipv6.sin6_addr)));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_MESSAGE_INTEGRITY, stun_attr_type(attr_hdr));
  EXPECT_EQ(1, stun_attr_msgint_check((stun_attr_msgint*)attr_hdr, msg_hdr,
      (uint8_t*)password, sizeof(password)-1));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_FINGERPRINT, stun_attr_type(attr_hdr));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(NULL, attr_hdr);
}